

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
::AdjustSequenceNumbering
          (TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
           *this)

{
  bool bVar1;
  int iVar2;
  TPZAdmChunkVector<TPZConnect,_10> *this_00;
  long *plVar3;
  int *piVar4;
  TPZCompEl **ppTVar5;
  TPZConnect *this_01;
  int64_t iVar6;
  TPZChunkVector<TPZCompEl_*,_10> *this_02;
  ostream *poVar7;
  long in_RDI;
  TPZConnect *nod_1;
  int64_t seqnum;
  int nelcon;
  TPZConnect *nod;
  iterator it;
  set<long,_std::less<long>,_std::allocator<long>_> depconnects;
  set<long,_std::less<long>,_std::allocator<long>_> indepconnects;
  int64_t connectcount;
  int64_t el;
  int64_t nelem;
  TPZCompEl *cel;
  int64_t i;
  TPZManVector<long,_10> permute;
  int64_t nconnect;
  size_t in_stack_00000218;
  char *in_stack_00000220;
  set<long,_std::less<long>,_std::allocator<long>_> *in_stack_fffffffffffffdf8;
  TPZManVector<long,_10> *in_stack_fffffffffffffe00;
  _Rb_tree_const_iterator<long> *in_stack_fffffffffffffe08;
  int64_t in_stack_fffffffffffffe18;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_fffffffffffffe20;
  TPZAdmChunkVector<TPZConnect,_10> *in_stack_fffffffffffffe28;
  TPZCompMesh *in_stack_fffffffffffffe30;
  _Self local_130;
  _Base_ptr local_128;
  _Rb_tree_const_iterator<long> local_120;
  undefined1 local_118 [48];
  undefined1 local_e8 [48];
  TPZCompMesh *local_b8;
  long local_b0;
  long local_a8;
  TPZCompEl *local_a0;
  int64_t local_98;
  TPZVec<long> local_80 [3];
  int64_t local_10;
  
  this_00 = TPZCompMesh::ConnectVec(*(TPZCompMesh **)(in_RDI + 8));
  local_10 = TPZChunkVector<TPZConnect,_10>::NElements
                       (&this_00->super_TPZChunkVector<TPZConnect,_10>);
  TPZManVector<long,_10>::TPZManVector
            ((TPZManVector<long,_10> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  (**(code **)(**(long **)(in_RDI + 8) + 0x78))();
  for (local_98 = 0; iVar6 = local_98, local_98 < local_10; local_98 = local_98 + 1) {
    plVar3 = TPZVec<long>::operator[](local_80,local_98);
    *plVar3 = iVar6;
  }
  local_a8 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0xb0));
  local_b8 = (TPZCompMesh *)0x0;
  for (local_98 = 0; local_98 < local_a8; local_98 = local_98 + 1) {
    piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0xb0),local_98);
    local_b0 = (long)*piVar4;
    if (-1 < local_b0) {
      TPZCompMesh::ElementVec(*(TPZCompMesh **)(in_RDI + 8));
      ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      local_a0 = *ppTVar5;
      if (local_a0 != (TPZCompEl *)0x0) {
        std::set<long,_std::less<long>,_std::allocator<long>_>::set
                  ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1dcfe59);
        std::set<long,_std::less<long>,_std::allocator<long>_>::set
                  ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1dcfe6b);
        (**(code **)(*(long *)local_a0 + 0x1d8))(local_a0,local_e8,local_118);
        std::_Rb_tree_const_iterator<long>::_Rb_tree_const_iterator(&local_120);
        local_128 = (_Base_ptr)
                    std::set<long,_std::less<long>,_std::allocator<long>_>::begin
                              (in_stack_fffffffffffffdf8);
        local_120._M_node = local_128;
        while( true ) {
          local_130._M_node =
               (_Base_ptr)
               std::set<long,_std::less<long>,_std::allocator<long>_>::end
                         (in_stack_fffffffffffffdf8);
          bVar1 = std::operator!=(&local_120,&local_130);
          if (!bVar1) break;
          TPZCompMesh::ConnectVec(*(TPZCompMesh **)(in_RDI + 8));
          std::_Rb_tree_const_iterator<long>::operator*((_Rb_tree_const_iterator<long> *)0x1dcff15);
          this_01 = TPZChunkVector<TPZConnect,_10>::operator[]
                              ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffe20,
                               in_stack_fffffffffffffe18);
          iVar2 = TPZConnect::NElConnected(this_01);
          iVar6 = TPZConnect::SequenceNumber(this_01);
          if (iVar2 == 1) {
            in_stack_fffffffffffffe30 = local_b8;
            local_b8 = (TPZCompMesh *)&local_b8->field_0x1;
            plVar3 = TPZVec<long>::operator[](local_80,iVar6);
            *plVar3 = (long)in_stack_fffffffffffffe30;
          }
          TPZConnect::DecrementElConnected(this_01);
          std::_Rb_tree_const_iterator<long>::operator++
                    (in_stack_fffffffffffffe08,(int)((ulong)in_stack_fffffffffffffe00 >> 0x20));
        }
        std::set<long,_std::less<long>,_std::allocator<long>_>::~set
                  ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1dd0031);
        std::set<long,_std::less<long>,_std::allocator<long>_>::~set
                  ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1dd003e);
      }
    }
  }
  for (local_98 = 0; local_98 < local_10; local_98 = local_98 + 1) {
    in_stack_fffffffffffffe28 = TPZCompMesh::ConnectVec(*(TPZCompMesh **)(in_RDI + 8));
    this_02 = (TPZChunkVector<TPZCompEl_*,_10> *)
              TPZChunkVector<TPZConnect,_10>::operator[]
                        ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffe20,
                         in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe20 = this_02;
    in_stack_fffffffffffffe18 = TPZConnect::SequenceNumber((TPZConnect *)this_02);
    if ((-1 < in_stack_fffffffffffffe18) &&
       (iVar2 = TPZConnect::NElConnected((TPZConnect *)this_02), 0 < iVar2)) {
      iVar6 = TPZConnect::SequenceNumber((TPZConnect *)this_02);
      in_stack_fffffffffffffe00 = (TPZManVector<long,_10> *)TPZVec<long>::operator[](local_80,iVar6)
      ;
      if ((long)(in_stack_fffffffffffffe00->super_TPZVec<long>)._vptr_TPZVec < (long)local_b8) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "void TPZFrontStructMatrix<TPZFrontSym<std::complex<double>>, std::complex<double>, TPZStructMatrixTBBFlow<CSTATE>>::AdjustSequenceNumbering() [TFront = TPZFrontSym<std::complex<double>>, TVar = std::complex<double>, TPar = TPZStructMatrixTBBFlow<CSTATE>]"
                                );
        std::operator<<(poVar7," very fishy\n");
        pzinternal::DebugStopImpl(in_stack_00000220,in_stack_00000218);
      }
    }
  }
  TPZCompMesh::Permute(in_stack_fffffffffffffe30,(TPZVec<long> *)in_stack_fffffffffffffe28);
  TPZManVector<long,_10>::~TPZManVector(in_stack_fffffffffffffe00);
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::AdjustSequenceNumbering()
{
	int64_t nconnect = this->fMesh->ConnectVec().NElements();
	TPZManVector<int64_t> permute(nconnect);
	this->fMesh->ComputeNodElCon();
	int64_t i;
	for(i=0; i<nconnect; i++)
	{
		permute[i] = i;
	}
	TPZCompEl *cel;
	int64_t nelem = fElementOrder.NElements();
	int64_t el;
	int64_t connectcount = 0;
	for(i=0; i<nelem; i++)
	{
		el = fElementOrder[i];
        if(el<0) continue;
		cel = this->fMesh->ElementVec()[el];
		if(!cel) continue;
		std::set<int64_t> indepconnects, depconnects;
		cel->BuildConnectList(indepconnects,depconnects);
		std::set<int64_t>::iterator it;
		for(it=indepconnects.begin(); it != indepconnects.end(); it++)
		{
			TPZConnect &nod = this->fMesh->ConnectVec()[*it];
			int nelcon = nod.NElConnected()-1;
			int64_t seqnum = nod.SequenceNumber();
			if(nelcon == 0) permute[seqnum]= connectcount++;
			nod.DecrementElConnected();
		}
	}
	for(i=0; i<nconnect; i++)
	{
		TPZConnect &nod = this->fMesh->ConnectVec()[i];
		if(nod.SequenceNumber() < 0 || nod.NElConnected() <= 0) continue;
		if(permute[nod.SequenceNumber()] < connectcount)
		{
			std::cout << __PRETTY_FUNCTION__ << " very fishy\n";
			DebugStop();
		}
	}
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " permutation " << permute;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	this->fMesh->Permute(permute);
}